

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListModeViewBase::doStaticLayout(QListModeViewBase *this,QListViewLayoutInfo *info)

{
  Representation *pRVar1;
  QList<int> *this_00;
  int iVar2;
  int iVar3;
  QListView *pQVar4;
  QListViewPrivate *pQVar5;
  QAbstractItemModel *pQVar6;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  undefined1 auVar7 [12];
  QPoint QVar8;
  Representation RVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  char cVar14;
  int iVar15;
  QPoint QVar16;
  long lVar17;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar18;
  QListViewLayoutInfo *pQVar19;
  QSize QVar20;
  int iVar21;
  int iVar22;
  QSize *pQVar23;
  int iVar24;
  Representation RVar25;
  Representation RVar26;
  QSize *pQVar27;
  Representation RVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  Bucket BVar34;
  QPoint local_1b0;
  QPersistentModelIndex local_150;
  QModelIndex local_148;
  QPoint local_128;
  undefined8 uStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar27 = &info->grid;
  pRVar1 = &(info->grid).ht;
  bVar32 = ((info->grid).ht.m_i | (info->grid).wd.m_i) < 0;
  QVar16 = initStaticLayout(this,info);
  local_1b0 = (QPoint)((ulong)QVar16 >> 0x20);
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  pQVar4 = (this->super_QCommonListViewBase).qq;
  (**(code **)(*(long *)&(pQVar4->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(pQVar4,&local_108);
  uVar10 = (info->bounds).x1;
  uVar11 = (info->bounds).y1;
  uVar12 = (info->bounds).x2;
  uVar13 = (info->bounds).y2;
  auVar7._8_4_ = uVar13;
  auVar7._4_4_ = uVar12;
  iVar15 = info->spacing;
  local_108.super_QStyleOption.rect.x1.m_i = uVar10 + iVar15;
  local_108.super_QStyleOption.rect.y1.m_i = uVar11 + iVar15;
  auVar7._0_4_ = uVar11 - iVar15;
  auVar33._0_8_ = auVar7._0_8_ << 0x20;
  auVar33._8_4_ = uVar12 - iVar15;
  auVar33._12_4_ = uVar13 - iVar15;
  local_108.super_QStyleOption.rect._8_8_ = auVar33._8_8_;
  if (info->flow == LeftToRight) {
    lVar17 = 8;
    pQVar19 = info;
    pQVar23 = (QSize *)pRVar1;
    QVar8 = QVar16;
  }
  else {
    lVar17 = 0xc;
    pQVar19 = (QListViewLayoutInfo *)&(info->bounds).y1;
    pQVar23 = pQVar27;
    pQVar27 = (QSize *)pRVar1;
    QVar8 = local_1b0;
    local_1b0 = (QPoint)((ulong)QVar16 & 0xffffffff);
  }
  uVar29 = (ulong)QVar8 & 0xffffffff;
  RVar28 = QVar8.xp.m_i;
  iVar15 = (pQVar23->wd).m_i;
  iVar24 = iVar15;
  if (bVar32) {
    iVar24 = (this->super_QCommonListViewBase).batchSavedDeltaSeg;
  }
  iVar22 = info->last;
  if (info->first <= iVar22) {
    iVar2 = (pQVar19->bounds).x1.m_i;
    iVar3 = *(int *)((long)&(info->bounds).x1.m_i + lVar17);
    iVar21 = (pQVar27->wd).m_i;
    this_00 = &this->flowPositions;
    RVar9.m_i = info->first;
    do {
      pQVar5 = (this->super_QCommonListViewBase).dd;
      local_148.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_148.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = (pQVar5->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_128,&(pQVar5->super_QAbstractItemViewPrivate).root);
      bVar30 = false;
      (**(code **)(*(long *)pQVar6 + 0x60))(&local_148,pQVar6,RVar9.m_i,0,(QModelIndex *)&local_128)
      ;
      auVar33 = (undefined1  [16])local_148._0_16_;
      local_118.ptr = local_148.m.ptr;
      local_128.xp.m_i = local_148.r;
      local_128.yp.m_i = local_148.c;
      uStack_120 = local_148.i;
      this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  **)(*(long *)((pQVar5->super_QAbstractItemViewPrivate).model + 8) + 0x90);
      local_148._0_16_ = auVar33;
      if (this_01 !=
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *)0x0) {
        BVar34 = QHashPrivate::
                 Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 ::findBucket<QtPrivate::QModelIndexWrapper>
                           (this_01,(QModelIndexWrapper *)&local_128);
        if (BVar34.span[BVar34.index] == (Span)0xff) {
          bVar30 = false;
        }
        else {
          bVar30 = *(long *)(BVar34.span + 0x80) != 0;
        }
      }
      if (bVar30) {
        QPersistentModelIndex::QPersistentModelIndex(&local_150,&local_148);
        this_02 = (pQVar5->hiddenRows).q_hash.d;
        if (this_02 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
        goto LAB_0057c565;
        pNVar18 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                  findNode<QPersistentModelIndex>(this_02,&local_150);
        bVar31 = pNVar18 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
      }
      else {
LAB_0057c565:
        bVar31 = false;
      }
      if (bVar30) {
        QPersistentModelIndex::~QPersistentModelIndex(&local_150);
      }
      RVar28.m_i = (int)uVar29;
      if (bVar31) {
        local_128.xp.m_i = RVar28.m_i;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)this_00,(this->flowPositions).d.size,(int *)&local_128);
        QList<int>::end(this_00);
      }
      else {
        if (bVar32) {
          pQVar5 = (this->super_QCommonListViewBase).dd;
          pQVar6 = (pQVar5->super_QAbstractItemViewPrivate).model;
          iVar15 = pQVar5->column;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&local_128,&(pQVar5->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar6 + 0x60))
                    (&local_148,pQVar6,RVar9.m_i,iVar15,(QModelIndex *)&local_128);
          QVar20 = QListViewPrivate::itemSize
                             ((this->super_QCommonListViewBase).dd,&local_108,&local_148);
          iVar15 = info->spacing;
          if (info->flow == LeftToRight) {
            iVar21 = QVar20.wd.m_i.m_i + iVar15;
            iVar15 = QVar20.ht.m_i.m_i + iVar15;
          }
          else {
            iVar21 = QVar20.ht.m_i.m_i + iVar15;
            iVar15 = QVar20.wd.m_i.m_i + iVar15;
          }
        }
        if ((info->wrap == true) && ((iVar3 - iVar2) + 1 <= iVar21 + RVar28.m_i)) {
          local_128.xp.m_i = RVar28.m_i;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&this->segmentExtents,(this->segmentExtents).d.size,
                     (int *)&local_128);
          QList<int>::end(&this->segmentExtents);
          local_1b0.xp.m_i = local_1b0.xp.m_i.m_i + iVar24 + info->spacing;
          local_1b0.yp.m_i = 0;
          RVar28.m_i = info->spacing + iVar2;
          local_128.xp.m_i = local_1b0.xp.m_i;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&this->segmentPositions,(this->segmentPositions).d.size,
                     (int *)&local_128);
          QList<int>::end(&this->segmentPositions);
          local_128.xp.m_i = RVar9.m_i;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&this->segmentStartRows,(this->segmentStartRows).d.size,
                     (int *)&local_128);
          QList<int>::end(&this->segmentStartRows);
          iVar24 = 0;
        }
        local_128.xp.m_i = (int)(this->flowPositions).d.size;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&this->scrollValueMap,(this->scrollValueMap).d.size,
                   (int *)&local_128);
        QList<int>::end(&this->scrollValueMap);
        local_128.xp.m_i = RVar28.m_i;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)this_00,(this->flowPositions).d.size,(int *)&local_128);
        QList<int>::end(this_00);
        if (iVar24 < iVar15) {
          iVar24 = iVar15;
        }
        uVar29 = (ulong)(uint)(RVar28.m_i + iVar21 + info->spacing);
      }
      RVar28.m_i = (int)uVar29;
      iVar22 = info->last;
      bVar30 = RVar9.m_i < iVar22;
      RVar9.m_i = RVar9.m_i + 1;
    } while (bVar30);
  }
  this->batchSavedPosition = RVar28.m_i;
  (this->super_QCommonListViewBase).batchSavedDeltaSeg = iVar24;
  (this->super_QCommonListViewBase).batchStartRow = iVar22 + 1;
  iVar15 = 0;
  if (iVar22 == info->max) {
    iVar15 = info->spacing;
  }
  iVar15 = RVar28.m_i - iVar15;
  if (info->flow == LeftToRight) {
    RVar26.m_i = iVar15;
    if ((this->segmentPositions).d.size != 1) {
      RVar26.m_i = (info->bounds).x2.m_i;
    }
    RVar25.m_i = local_1b0.xp.m_i + iVar24;
  }
  else {
    RVar25.m_i = iVar15;
    if ((this->segmentPositions).d.size != 1) {
      RVar25.m_i = (info->bounds).y2.m_i;
    }
    RVar26.m_i = local_1b0.xp.m_i + iVar24;
  }
  QVar20.ht.m_i = RVar25.m_i;
  QVar20.wd.m_i = RVar26.m_i;
  (this->super_QCommonListViewBase).contentsSize = QVar20;
  if (info->last == info->max) {
    local_128.xp.m_i = iVar15;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->segmentExtents,(this->segmentExtents).d.size,
               (int *)&local_128);
    QList<int>::end(&this->segmentExtents);
    local_128.xp.m_i = (int)(this->flowPositions).d.size;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->scrollValueMap,(this->scrollValueMap).d.size,
               (int *)&local_128);
    QList<int>::end(&this->scrollValueMap);
    local_128.xp.m_i = iVar15;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->flowPositions,(this->flowPositions).d.size,
               (int *)&local_128);
    QList<int>::end(&this->flowPositions);
    local_128.xp.m_i = 0x7fffffff;
    if (info->wrap != false) {
      local_128.xp.m_i = local_1b0.xp.m_i + iVar24;
    }
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->segmentPositions,(this->segmentPositions).d.size,
               (int *)&local_128);
    QList<int>::end(&this->segmentPositions);
  }
  uStack_120 = CONCAT44(RVar25.m_i,RVar26.m_i);
  local_128 = QVar16;
  local_148._0_16_ =
       QWidgetPrivate::clipRect((QWidgetPrivate *)(this->super_QCommonListViewBase).dd);
  cVar14 = QRect::intersects((QRect *)&local_148);
  if (cVar14 != '\0') {
    QWidget::update((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                    super_QAbstractScrollAreaPrivate.viewport);
  }
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModeViewBase::doStaticLayout(const QListViewLayoutInfo &info)
{
    const bool useItemSize = !info.grid.isValid();
    const QPoint topLeft = initStaticLayout(info);
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    option.rect = info.bounds;
    option.rect.adjust(info.spacing, info.spacing, -info.spacing, -info.spacing);

    // The static layout data structures are as follows:
    // One vector contains the coordinate in the direction of layout flow.
    // Another vector contains the coordinates of the segments.
    // A third vector contains the index (model row) of the first item
    // of each segment.

    int segStartPosition;
    int segEndPosition;
    int deltaFlowPosition;
    int deltaSegPosition;
    int deltaSegHint;
    int flowPosition;
    int segPosition;

    if (info.flow == QListView::LeftToRight) {
        segStartPosition = info.bounds.left();
        segEndPosition = info.bounds.width();
        flowPosition = topLeft.x();
        segPosition = topLeft.y();
        deltaFlowPosition = info.grid.width(); // dx
        deltaSegPosition = useItemSize ? batchSavedDeltaSeg : info.grid.height(); // dy
        deltaSegHint = info.grid.height();
    } else { // flow == QListView::TopToBottom
        segStartPosition = info.bounds.top();
        segEndPosition = info.bounds.height();
        flowPosition = topLeft.y();
        segPosition = topLeft.x();
        deltaFlowPosition = info.grid.height(); // dy
        deltaSegPosition = useItemSize ? batchSavedDeltaSeg : info.grid.width(); // dx
        deltaSegHint = info.grid.width();
    }

    for (int row = info.first; row <= info.last; ++row) {
        if (isHidden(row)) { // ###
            flowPositions.append(flowPosition);
        } else {
            // if we are not using a grid, we need to find the deltas
            if (useItemSize) {
                QSize hint = itemSize(option, modelIndex(row));
                if (info.flow == QListView::LeftToRight) {
                    deltaFlowPosition = hint.width() + info.spacing;
                    deltaSegHint = hint.height() + info.spacing;
                } else { // TopToBottom
                    deltaFlowPosition = hint.height() + info.spacing;
                    deltaSegHint = hint.width() + info.spacing;
                }
            }
            // create new segment
            if (info.wrap && (flowPosition + deltaFlowPosition >= segEndPosition)) {
                segmentExtents.append(flowPosition);
                flowPosition = info.spacing + segStartPosition;
                segPosition += info.spacing + deltaSegPosition;
                segmentPositions.append(segPosition);
                segmentStartRows.append(row);
                deltaSegPosition = 0;
            }
            // save the flow position of this item
            scrollValueMap.append(flowPositions.size());
            flowPositions.append(flowPosition);
            // prepare for the next item
            deltaSegPosition = qMax(deltaSegHint, deltaSegPosition);
            flowPosition += info.spacing + deltaFlowPosition;
        }
    }
    // used when laying out next batch
    batchSavedPosition = flowPosition;
    batchSavedDeltaSeg = deltaSegPosition;
    batchStartRow = info.last + 1;
    if (info.last == info.max)
        flowPosition -= info.spacing; // remove extra spacing
    // set the contents size
    QRect rect = info.bounds;
    if (info.flow == QListView::LeftToRight) {
        rect.setRight(segmentPositions.size() == 1 ? flowPosition : info.bounds.right());
        rect.setBottom(segPosition + deltaSegPosition);
    } else { // TopToBottom
        rect.setRight(segPosition + deltaSegPosition);
        rect.setBottom(segmentPositions.size() == 1 ? flowPosition : info.bounds.bottom());
    }
    contentsSize = QSize(rect.right(), rect.bottom());
    // if it is the last batch, save the end of the segments
    if (info.last == info.max) {
        segmentExtents.append(flowPosition);
        scrollValueMap.append(flowPositions.size());
        flowPositions.append(flowPosition);
        segmentPositions.append(info.wrap ? segPosition + deltaSegPosition : INT_MAX);
    }
    // if the new items are visible, update the viewport
    QRect changedRect(topLeft, rect.bottomRight());
    if (clipRect().intersects(changedRect))
        viewport()->update();
}